

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O1

JL_STATUS JlGetObjectFromDictionaryByKey
                    (JlDataObject *DictionaryObject,char *KeyName,JlDataObject **pObject)

{
  JL_DATA_TYPE JVar1;
  bool bVar2;
  int iVar3;
  JlDataObject *pJVar4;
  JL_STATUS JVar5;
  char *__s1;
  JlDictionaryItem *pJVar6;
  
  JVar5 = JL_STATUS_INVALID_PARAMETER;
  if (pObject != (JlDataObject **)0x0 &&
      (KeyName != (char *)0x0 && DictionaryObject != (JlDataObject *)0x0)) {
    *pObject = (JlDataObject *)0x0;
    JVar1 = DictionaryObject->Type;
    pJVar6 = (JlDictionaryItem *)0x0;
    do {
      JVar5 = JL_STATUS_WRONG_TYPE;
      if (JVar1 == JL_DATA_TYPE_DICTIONARY) {
        if (pJVar6 == (JlDictionaryItem *)0x0) {
          pJVar6 = (DictionaryObject->field_2).Dictionary.DictionaryHead;
        }
        else {
          if (pJVar6->ParentDictionary != (JlDictionary *)&DictionaryObject->field_2)
          goto LAB_00119a84;
          pJVar6 = pJVar6->Next;
        }
        if (pJVar6 == (JlDictionaryItem *)0x0) {
          JVar5 = JL_STATUS_NOT_FOUND;
          goto LAB_00119a84;
        }
        __s1 = pJVar6->KeyName;
        pJVar4 = pJVar6->Object;
        JVar5 = JL_STATUS_SUCCESS;
        bVar2 = true;
      }
      else {
LAB_00119a84:
        pJVar4 = (JlDataObject *)0x0;
        __s1 = (char *)0x0;
        bVar2 = false;
      }
      if (!bVar2) {
        return JVar5;
      }
      iVar3 = strcmp(__s1,KeyName);
      if (iVar3 == 0) {
        *pObject = pJVar4;
        return JVar5;
      }
    } while (bVar2);
  }
  return JVar5;
}

Assistant:

JL_STATUS
    JlGetObjectFromDictionaryByKey
    (
        JlDataObject const*         DictionaryObject,
        char const*                 KeyName,
        JlDataObject**              pObject
    )
{
    JL_STATUS jlStatus = JL_STATUS_SUCCESS;
    JlDictionaryItem* enumerator = NULL;

    if(     NULL != DictionaryObject
        &&  NULL != KeyName
        &&  NULL != pObject )
    {
        *pObject = NULL;

        while( JL_STATUS_SUCCESS == jlStatus )
        {
            JlDataObject* object = NULL;
            char const* key = NULL;

            jlStatus = JlGetObjectDictionaryNextItem( DictionaryObject, &object, &key, &enumerator );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                if( strcmp( key, KeyName ) == 0 )
                {
                    // Found
                    *pObject = object;
                    break;
                }
            }
        }

        if( JL_STATUS_END_OF_DATA == jlStatus )
        {
            // This means we got to end of dictionary and did not find the key
            jlStatus = JL_STATUS_NOT_FOUND;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}